

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  LogMessage *other;
  Type *value;
  int iVar2;
  int local_74;
  int i;
  void **elements;
  byte local_51;
  LogMessage local_50;
  int local_14;
  RepeatedPtrFieldBase *pRStack_10;
  int n;
  RepeatedPtrFieldBase *this_local;
  
  local_14 = this->current_size_;
  local_51 = 0;
  pRStack_10 = this;
  if (local_14 < 0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x60a);
    local_51 = 1;
    other = LogMessage::operator<<(&local_50,"CHECK failed: (n) >= (0): ");
    LogFinisher::operator=((LogFinisher *)((long)&elements + 3),other);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  if (0 < local_14) {
    pRVar1 = this->rep_;
    local_74 = 0;
    do {
      iVar2 = local_74 + 1;
      value = cast<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::TypeHandler>
                        (pRVar1->elements[local_74]);
      GenericTypeHandler<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::Clear
                (value);
      local_74 = iVar2;
    } while (iVar2 < local_14);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}